

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  string *filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_unknown_0 *paVar1;
  GeneratorContextImpl *this_01;
  CommandLineInterface *this_02;
  bool bVar2;
  ParseArgumentStatus PVar3;
  ssize_t sVar4;
  long lVar5;
  FileDescriptor *pFVar6;
  iterator iVar7;
  ostream *poVar8;
  pointer pOVar9;
  mapped_type *ppGVar10;
  mapped_type generator_context;
  Type *this_03;
  FileDescriptor **ppFVar11;
  LogMessage *pLVar12;
  _Rb_tree_header *p_Var13;
  ulong uVar14;
  FileDescriptor **ppFVar15;
  pointer ppVar16;
  undefined8 uVar17;
  pointer pbVar18;
  anon_unknown_0 *paVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  __node_base _Var23;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  GeneratorContextMap output_directories;
  ErrorPrinter error_collector;
  Importer importer;
  DiskSourceTree source_tree;
  char buffer [4096];
  LogFinisher local_1271;
  CommandLineInterface *local_1270;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_1268;
  undefined1 local_1248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1238 [5];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_11e0;
  undefined1 local_11a8 [16];
  int *local_1198 [5];
  string *local_1170;
  MultiFileErrorCollector local_1168;
  ErrorCollector local_1160;
  ErrorFormat local_1158;
  DiskSourceTree *local_1150;
  char local_1148;
  undefined1 local_1140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1130 [5];
  DescriptorPool local_10e0;
  DiskSourceTree local_1078;
  undefined1 local_1038 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028;
  _Alloc_hider local_1018;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1008 [253];
  
  Clear(this);
  PVar3 = ParseArguments(this,argc,argv);
  if (PVar3 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar3 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_1140._8_8_ = (string *)0x0;
  local_1130[0]._M_local_buf[0] = '\0';
  local_1140._0_8_ = (anon_unknown_0 *)(local_1140 + 0x10);
  sVar4 = readlink("/proc/self/exe",local_1038,0x1000);
  if (0 < (int)sVar4) {
    std::__cxx11::string::_M_replace((ulong)local_1140,0,(char *)local_1140._8_8_,(ulong)local_1038)
    ;
    lVar5 = std::__cxx11::string::find_last_of(local_1140,0x34f045,0xffffffffffffffff);
    if (1 < lVar5 + 1U) {
      std::__cxx11::string::substr((ulong)local_1038,(ulong)local_1140);
      std::__cxx11::string::operator=((string *)local_1140,(string *)local_1038);
      paVar1 = (anon_unknown_0 *)(local_1038 + 0x10);
      if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
        operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
      }
      bVar2 = anon_unknown_0::IsInstalledProtoPath
                        ((anon_unknown_0 *)local_1140._0_8_,(string *)local_1140._8_8_);
      this_00 = &this->proto_path_;
      if (bVar2) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1038,(char (*) [1])0x352e3b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1140);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)this_00,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1038);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1018._M_p != local_1008) {
          operator_delete(local_1018._M_p,local_1008[0]._M_allocated_capacity + 1);
        }
        uVar17 = local_1028._M_allocated_capacity;
        paVar19 = (anon_unknown_0 *)local_1038._0_8_;
        if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
LAB_002036d3:
          operator_delete(paVar19,uVar17 + 1);
        }
      }
      else {
        local_1038._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,local_1140._0_8_,
                   (anon_unknown_0 *)(local_1140._0_8_ + (long)(_Alloc_hider *)local_1140._8_8_));
        std::__cxx11::string::append(local_1038);
        bVar2 = anon_unknown_0::IsInstalledProtoPath
                          ((anon_unknown_0 *)local_1038._0_8_,(string *)local_1038._8_8_);
        if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
          operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_1248._0_8_ = (anon_unknown_0 *)(local_1248 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1248,local_1140._0_8_,
                     (anon_unknown_0 *)(local_1140._0_8_ + (long)(_Alloc_hider *)local_1140._8_8_));
          std::__cxx11::string::append(local_1248);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1038,(char (*) [1])0x352e3b,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248
                    );
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1038);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1018._M_p != local_1008) {
            operator_delete(local_1018._M_p,local_1008[0]._M_allocated_capacity + 1);
          }
          if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
            operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
          }
          uVar17 = local_1238[0]._M_allocated_capacity;
          paVar19 = (anon_unknown_0 *)local_1248._0_8_;
          if ((anon_unknown_0 *)local_1248._0_8_ != (anon_unknown_0 *)(local_1248 + 0x10))
          goto LAB_002036d3;
        }
        else {
          lVar5 = std::__cxx11::string::find_last_of(local_1140,0x34f045,0xffffffffffffffff);
          if (1 < lVar5 + 1U) {
            std::__cxx11::string::substr((ulong)local_1038,(ulong)local_1140);
            std::__cxx11::string::operator=((string *)local_1140,(string *)local_1038);
            if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
              operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
            }
            local_1038._0_8_ = paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1038,local_1140._0_8_,
                       (anon_unknown_0 *)(local_1140._0_8_ + (long)(_Alloc_hider *)local_1140._8_8_)
                      );
            std::__cxx11::string::append(local_1038);
            bVar2 = anon_unknown_0::IsInstalledProtoPath
                              ((anon_unknown_0 *)local_1038._0_8_,(string *)local_1038._8_8_);
            if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
              operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
            }
            if (bVar2) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1140,"/include");
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1038,(char (*) [1])0x352e3b,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1248);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)this_00,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1038);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1038);
              uVar17 = local_1238[0]._M_allocated_capacity;
              paVar19 = (anon_unknown_0 *)local_1248._0_8_;
              if ((anon_unknown_0 *)local_1248._0_8_ != (anon_unknown_0 *)(local_1248 + 0x10))
              goto LAB_002036d3;
            }
          }
        }
      }
    }
  }
  if ((anon_unknown_0 *)local_1140._0_8_ != (anon_unknown_0 *)(local_1140 + 0x10)) {
    operator_delete((void *)local_1140._0_8_,
                    CONCAT71(local_1130[0]._M_allocated_capacity._1_7_,local_1130[0]._M_local_buf[0]
                            ) + 1);
  }
  DiskSourceTree::DiskSourceTree(&local_1078);
  ppVar16 = (this->proto_path_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar16) {
    lVar5 = 0x20;
    uVar20 = 0;
    do {
      DiskSourceTree::MapPath
                (&local_1078,(string *)((long)ppVar16 + lVar5 + -0x20),
                 (string *)((long)&(ppVar16->first)._M_dataplus._M_p + lVar5));
      uVar20 = uVar20 + 1;
      ppVar16 = (this->proto_path_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while (uVar20 < (ulong)((long)(this->proto_path_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar16 >> 6)
            );
  }
  if (this->inputs_are_proto_path_relative_ == false) {
    bVar2 = MakeInputsBeProtoPathRelative(this,&local_1078);
    iVar22 = 1;
    if (!bVar2) goto LAB_0020427f;
  }
  local_1158 = this->error_format_;
  local_1168._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0041ed20;
  local_1160._vptr_ErrorCollector = (_func_int **)&PTR__ErrorPrinter_0041ed60;
  local_1148 = '\0';
  local_1150 = &local_1078;
  Importer::Importer((Importer *)local_1140,&local_1078.super_SourceTree,&local_1168);
  local_1268.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (FileDescriptor **)0x0;
  local_1268.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FileDescriptor **)0x0;
  local_1268.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FileDescriptor **)0x0;
  pbVar18 = (this->input_files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1270 = this;
  if ((this->input_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar18) {
    local_1170 = &this->direct_dependencies_violation_msg_;
    uVar20 = 0;
    do {
      Importer::AddUnusedImportTrackFile((Importer *)local_1140,pbVar18 + uVar20);
      local_11e0._M_buckets =
           (__buckets_ptr)
           Importer::Import((Importer *)local_1140,
                            (local_1270->input_files_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar20);
      Importer::ClearUnusedImportTrackFiles((Importer *)local_1140);
      if ((FileDescriptor *)local_11e0._M_buckets == (FileDescriptor *)0x0) {
LAB_00204066:
        iVar22 = 1;
        goto LAB_00204241;
      }
      if (local_1268.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1268.
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                  ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)&local_1268,
                   (iterator)
                   local_1268.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FileDescriptor **)&local_11e0);
      }
      else {
        *local_1268.
         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (FileDescriptor *)local_11e0._M_buckets;
        local_1268.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1268.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((local_1270->disallow_services_ == true) &&
         (0 < *(int *)((long)local_11e0._M_buckets + 0x78))) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,*(char **)*local_11e0._M_buckets,
                            *(long *)(*local_11e0._M_buckets + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,": This file contains services, but --disallow_services was used.",0x40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_00204066;
      }
      if ((local_1270->direct_dependencies_explicitly_set_ == true) &&
         (0 < *(int *)((long)local_11e0._M_buckets + 0x18))) {
        iVar22 = 0;
        bVar2 = false;
        do {
          while( true ) {
            pFVar6 = FileDescriptor::dependency((FileDescriptor *)local_11e0._M_buckets,iVar22);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&(this->direct_dependencies_)._M_t,*(key_type **)pFVar6);
            if ((_Rb_tree_header *)iVar7._M_node !=
                &(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header) break;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)*local_11e0._M_buckets,
                                *(long *)(*local_11e0._M_buckets + 1));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            local_1248._0_8_ = local_1248 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,"%s","");
            pFVar6 = FileDescriptor::dependency((FileDescriptor *)local_11e0._M_buckets,iVar22);
            StringReplace((string *)local_1038,local_1170,(string *)local_1248,*(string **)pFVar6,
                          true);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_1038._0_8_,local_1038._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if ((anon_unknown_0 *)local_1038._0_8_ != (anon_unknown_0 *)(local_1038 + 0x10)) {
              operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
            }
            if ((anon_unknown_0 *)local_1248._0_8_ != (anon_unknown_0 *)(local_1248 + 0x10)) {
              operator_delete((void *)local_1248._0_8_,local_1238[0]._M_allocated_capacity + 1);
            }
            iVar22 = iVar22 + 1;
            bVar2 = true;
            if (*(int *)((long)local_11e0._M_buckets + 0x18) <= iVar22) goto LAB_00204066;
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 < *(int *)((long)local_11e0._M_buckets + 0x18));
        if (bVar2) goto LAB_00204066;
      }
      uVar20 = uVar20 + 1;
      pbVar18 = (local_1270->input_files_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(local_1270->input_files_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5)
            );
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_11e0,0,
               (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1038,(key_equal *)local_1248,(allocator_type *)local_11a8);
  this_02 = local_1270;
  if ((local_1270->mode_ == MODE_COMPILE) &&
     (pOVar9 = (local_1270->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (local_1270->output_directives_).
     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
     ._M_impl.super__Vector_impl_data._M_finish != pOVar9)) {
    lVar5 = 0;
    uVar20 = 0;
    do {
      local_1038._0_8_ = local_1038 + 0x10;
      lVar21 = *(long *)((long)&(pOVar9->output_location)._M_dataplus._M_p + lVar5);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1038,lVar21,
                 *(long *)((long)&(pOVar9->output_location)._M_string_length + lVar5) + lVar21);
      local_1248._0_8_ = (anon_unknown_0 *)(local_1248 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,".zip","");
      if (((ulong)local_1038._8_8_ < (ulong)local_1248._8_8_) ||
         (iVar22 = std::__cxx11::string::compare
                             ((ulong)local_1038,local_1038._8_8_ - local_1248._8_8_,
                              (string *)local_1248._8_8_), iVar22 != 0)) {
        local_11a8._0_8_ = local_1198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,".jar","");
        bVar2 = true;
        if ((ulong)local_11a8._8_8_ <= (ulong)local_1038._8_8_) {
          iVar22 = std::__cxx11::string::compare
                             ((ulong)local_1038,local_1038._8_8_ - local_11a8._8_8_,
                              (string *)local_11a8._8_8_);
          bVar2 = iVar22 != 0;
        }
        if ((int **)local_11a8._0_8_ != local_1198) {
          operator_delete((void *)local_11a8._0_8_,(long)local_1198[0] + 1);
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_unknown_0 *)local_1248._0_8_ != (anon_unknown_0 *)(local_1248 + 0x10)) {
        operator_delete((void *)local_1248._0_8_,local_1238[0]._M_allocated_capacity + 1);
      }
      if (((bVar2) && ((string *)local_1038._8_8_ != (string *)0x0)) &&
         (((anon_unknown_0 *)(local_1038._0_8_ + -1))[local_1038._8_8_] != (anon_unknown_0)0x2f)) {
        std::__cxx11::string::push_back((char)(key_type *)local_1038);
      }
      ppGVar10 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_11e0,(key_type *)local_1038);
      generator_context = *ppGVar10;
      if (generator_context == (mapped_type)0x0) {
        generator_context = (mapped_type)operator_new(0x48);
        (generator_context->super_GeneratorContext)._vptr_GeneratorContext =
             (_func_int **)&PTR__GeneratorContextImpl_0041ec60;
        p_Var13 = &(generator_context->files_)._M_t._M_impl.super__Rb_tree_header;
        (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var13->_M_header;
        (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var13->_M_header;
        (generator_context->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        generator_context->parsed_files_ = &local_1268;
        generator_context->had_error_ = false;
        *ppGVar10 = generator_context;
      }
      bVar2 = GenerateOutput(this_02,&local_1268,
                             (OutputDirective *)
                             ((long)&(((this_02->output_directives_).
                                       super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus
                                     ._M_p + lVar5),&generator_context->super_GeneratorContext);
      if (!bVar2) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&local_11e0);
        if ((anon_unknown_0 *)local_1038._0_8_ != (anon_unknown_0 *)(local_1038 + 0x10)) {
          operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
        }
        goto LAB_002040a2;
      }
      if ((anon_unknown_0 *)local_1038._0_8_ != (anon_unknown_0 *)(local_1038 + 0x10)) {
        operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
      }
      uVar20 = uVar20 + 1;
      pOVar9 = (this_02->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this_02->output_directives_).
                      super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar9 >> 3) *
               0x4ec4ec4ec4ec4ec5;
      lVar5 = lVar5 + 0x68;
    } while (uVar20 <= uVar14 && uVar14 - uVar20 != 0);
  }
  if (local_11e0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    paVar1 = (anon_unknown_0 *)(local_1038 + 0x10);
    _Var23._M_nxt = local_11e0._M_before_begin._M_nxt;
    do {
      this_01 = (GeneratorContextImpl *)_Var23._M_nxt[5]._M_nxt;
      local_1038._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"/","");
      filename = (string *)(_Var23._M_nxt + 1);
      if ((string *)_Var23._M_nxt[2]._M_nxt < (ulong)local_1038._8_8_) {
        bVar2 = false;
      }
      else {
        iVar22 = std::__cxx11::string::compare
                           ((ulong)filename,(long)_Var23._M_nxt[2]._M_nxt - local_1038._8_8_,
                            (string *)local_1038._8_8_);
        bVar2 = iVar22 == 0;
      }
      if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
        operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
      }
      if (bVar2) {
        bVar2 = GeneratorContextImpl::WriteAllToDisk(this_01,filename);
      }
      else {
        local_1038._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,".jar","");
        if (_Var23._M_nxt[2]._M_nxt < (ulong)local_1038._8_8_) {
          bVar2 = false;
        }
        else {
          iVar22 = std::__cxx11::string::compare
                             ((ulong)filename,(long)_Var23._M_nxt[2]._M_nxt - local_1038._8_8_,
                              (string *)local_1038._8_8_);
          bVar2 = iVar22 == 0;
        }
        if ((anon_unknown_0 *)local_1038._0_8_ != paVar1) {
          operator_delete((void *)local_1038._0_8_,local_1028._M_allocated_capacity + 1);
        }
        if (bVar2) {
          GeneratorContextImpl::AddJarManifest(this_01);
        }
        bVar2 = GeneratorContextImpl::WriteAllToZip(this_01,filename);
      }
      if (bVar2 == false) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&local_11e0);
        goto LAB_002040a2;
      }
      _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt;
    } while (_Var23._M_nxt != (_Hash_node_base *)0x0);
  }
  if ((this_02->dependency_out_name_)._M_string_length != 0) {
    bVar2 = GenerateDependencyManifestFile
                      (this_02,&local_1268,(GeneratorContextMap *)&local_11e0,&local_1078);
    iVar22 = 1;
    if (bVar2) goto LAB_00203c07;
    goto LAB_00204234;
  }
LAB_00203c07:
  STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
            ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
              *)&local_11e0);
  if ((this_02->descriptor_set_name_)._M_string_length != 0) {
    bVar2 = WriteDescriptorSet(this_02,&local_1268);
    iVar22 = 1;
    if (!bVar2) goto LAB_00204234;
  }
  if (this_02->mode_ - MODE_ENCODE < 2) {
    if ((this_02->codec_type_)._M_string_length == 0) {
      DescriptorPool::DescriptorPool((DescriptorPool *)local_1248);
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1038);
      FileDescriptorProto::set_name((FileDescriptorProto *)local_1038,"empty_message.proto");
      this_03 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          ((RepeatedPtrFieldBase *)local_1008,(Type *)0x0);
      DescriptorProto::set_name(this_03,"EmptyMessage");
      pFVar6 = DescriptorPool::BuildFile
                         ((DescriptorPool *)local_1248,(FileDescriptorProto *)local_1038);
      if (pFVar6 == (FileDescriptor *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_11a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x387);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)local_11a8,"CHECK failed: pool.BuildFile(file) != NULL: "
                            );
        internal::LogFinisher::operator=(&local_1271,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)local_11a8);
      }
      std::__cxx11::string::operator=((string *)&this_02->codec_type_,"EmptyMessage");
      bVar2 = EncodeOrDecode(this_02,(DescriptorPool *)local_1248);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1038);
      DescriptorPool::~DescriptorPool((DescriptorPool *)local_1248);
      iVar22 = 1;
      if (bVar2) goto LAB_002041a0;
    }
    else {
      bVar2 = EncodeOrDecode(this_02,&local_10e0);
      iVar22 = 1;
      if (bVar2) goto LAB_002041a0;
    }
  }
  else {
LAB_002041a0:
    iVar22 = 1;
    if ((local_1148 == '\0') && (iVar22 = 0, this_02->mode_ == MODE_PRINT)) {
      if (this_02->print_mode_ == PRINT_NONE) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1038,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x3a2);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)local_1038,
                             "If the code reaches here, it usually means a bug of flag parsing in the CommonadLineInterface."
                            );
        internal::LogFinisher::operator=((LogFinisher *)local_1248,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)local_1038);
LAB_002040a2:
        iVar22 = 1;
      }
      else if ((this_02->print_mode_ == PRINT_FREE_FIELDS) &&
              (local_1268.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_1268.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
        uVar20 = 0;
        iVar22 = 0;
        ppFVar11 = local_1268.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar15 = local_1268.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        do {
          pFVar6 = ppFVar11[uVar20];
          if (0 < *(int *)(pFVar6 + 0x58)) {
            lVar5 = 0;
            lVar21 = 0;
            do {
              PrintFreeFieldNumbers(this_02,(Descriptor *)(*(long *)(pFVar6 + 0x60) + lVar5));
              lVar21 = lVar21 + 1;
              lVar5 = lVar5 + 0xa8;
              ppFVar11 = local_1268.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppFVar15 = local_1268.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            } while (lVar21 < *(int *)(pFVar6 + 0x58));
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < (ulong)((long)ppFVar15 - (long)ppFVar11 >> 3));
      }
    }
  }
LAB_00204234:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_11e0);
LAB_00204241:
  if (local_1268.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (FileDescriptor **)0x0) {
    operator_delete(local_1268.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1268.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1268.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Importer::~Importer((Importer *)local_1140);
  io::ErrorCollector::~ErrorCollector(&local_1160);
  MultiFileErrorCollector::~MultiFileErrorCollector(&local_1168);
LAB_0020427f:
  DiskSourceTree::~DiskSourceTree(&local_1078);
  return iVar22;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  DiskSourceTree source_tree;
  for (int i = 0; i < proto_path_.size(); i++) {
    source_tree.MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if necessary.
  if (!inputs_are_proto_path_relative_) {
    if (!MakeInputsBeProtoPathRelative(&source_tree)) {
      return 1;
    }
  }

  // Allocate the Importer.
  ErrorPrinter error_collector(error_format_, &source_tree);
  Importer importer(&source_tree, &error_collector);

  std::vector<const FileDescriptor*> parsed_files;

  // Parse each file.
  for (int i = 0; i < input_files_.size(); i++) {
    // Import the file.
    importer.AddUnusedImportTrackFile(input_files_[i]);
    const FileDescriptor* parsed_file = importer.Import(input_files_[i]);
    importer.ClearUnusedImportTrackFiles();
    if (parsed_file == NULL) return 1;
    parsed_files.push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      cerr << parsed_file->name() << ": This file contains services, but "
              "--disallow_services was used." << endl;
      return 1;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        return 1;
      }
    }
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar")) {
        AddTrailingSlash(&output_location);
      }
      GeneratorContextImpl** map_slot = &output_directories[output_location];

      if (*map_slot == NULL) {
        // First time we've seen this output location.
        *map_slot = new GeneratorContextImpl(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i], *map_slot)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (GeneratorContextMap::iterator iter = output_directories.begin();
       iter != output_directories.end(); ++iter) {
    const string& location = iter->first;
    GeneratorContextImpl* directory = iter->second;
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        &source_tree)) {
      return 1;
    }
  }

  STLDeleteValues(&output_directories);

  if (!descriptor_set_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(importer.pool())) {
        return 1;
      }
    }
  }

  if (error_collector.FoundErrors()) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                     "flag parsing in the CommonadLineInterface.";
        return 1;

      // Do not add a default case.
    }
  }

  return 0;
}